

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O1

void __thiscall
cmOutputRequiredFilesCommand::ListDependencies
          (cmOutputRequiredFilesCommand *this,cmDependInformation *info,FILE *fout,
          set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
          *visited)

{
  _Rb_tree_header *p_Var1;
  cmDependInformation *info_00;
  _Base_ptr p_Var2;
  pointer pcVar3;
  int iVar4;
  _Base_ptr p_Var5;
  long lVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  bool bVar9;
  string tmp;
  long *local_a8 [2];
  long local_98 [2];
  cmOutputRequiredFilesCommand *local_88;
  _Rb_tree_node_base *local_80;
  cmDependInformation *local_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_88 = this;
  local_78 = info;
  std::
  _Rb_tree<cmDependInformation_const*,cmDependInformation_const*,std::_Identity<cmDependInformation_const*>,std::less<cmDependInformation_const*>,std::allocator<cmDependInformation_const*>>
  ::_M_insert_unique<cmDependInformation_const*const&>
            ((_Rb_tree<cmDependInformation_const*,cmDependInformation_const*,std::_Identity<cmDependInformation_const*>,std::less<cmDependInformation_const*>,std::allocator<cmDependInformation_const*>>
              *)visited,&local_78);
  p_Var7 = (local_78->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_80 = &(local_78->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var7 != local_80) {
    p_Var1 = &(visited->_M_t)._M_impl.super__Rb_tree_header;
    do {
      info_00 = *(cmDependInformation **)(p_Var7 + 1);
      p_Var2 = (visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
          p_Var2 = (&p_Var2->_M_left)[*(cmDependInformation **)(p_Var2 + 1) < info_00]) {
        if (*(cmDependInformation **)(p_Var2 + 1) >= info_00) {
          p_Var5 = p_Var2;
        }
      }
      p_Var8 = p_Var1;
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         (p_Var8 = (_Rb_tree_header *)p_Var5,
         info_00 < (cmDependInformation *)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
        p_Var8 = p_Var1;
      }
      if (p_Var8 == p_Var1) {
        if ((local_78->FullPath)._M_string_length != 0) {
          local_a8[0] = local_98;
          pcVar3 = (info_00->FullPath)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a8,pcVar3,pcVar3 + (info_00->FullPath)._M_string_length);
          lVar6 = std::__cxx11::string::rfind((char)(string *)local_a8,0x2e);
          if (lVar6 == -1) {
            bVar9 = false;
          }
          else {
            std::__cxx11::string::substr((ulong)local_50,(ulong)local_a8);
            iVar4 = std::__cxx11::string::compare((char *)local_50);
            bVar9 = iVar4 != 0;
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
          }
          if (bVar9) {
            std::__cxx11::string::substr((ulong)local_70,(ulong)local_a8);
            std::__cxx11::string::operator=((string *)local_a8,(string *)local_70);
            if (local_70[0] != local_60) {
              operator_delete(local_70[0],local_60[0] + 1);
            }
            fprintf((FILE *)fout,"%s\n",(info_00->FullPath)._M_dataplus._M_p);
          }
          if (local_a8[0] != local_98) {
            operator_delete(local_a8[0],local_98[0] + 1);
          }
        }
        ListDependencies(local_88,info_00,fout,visited);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_80);
  }
  return;
}

Assistant:

void cmOutputRequiredFilesCommand::ListDependencies(
  cmDependInformation const* info, FILE* fout,
  std::set<cmDependInformation const*>* visited)
{
  // add info to the visited set
  visited->insert(info);
  // now recurse with info's dependencies
  for (cmDependInformation* d : info->DependencySet) {
    if (visited->find(d) == visited->end()) {
      if (!info->FullPath.empty()) {
        std::string tmp = d->FullPath;
        std::string::size_type pos = tmp.rfind('.');
        if (pos != std::string::npos && (tmp.substr(pos) != ".h")) {
          tmp = tmp.substr(0, pos);
          fprintf(fout, "%s\n", d->FullPath.c_str());
        }
      }
      this->ListDependencies(d, fout, visited);
    }
  }
}